

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  Variant *pVVar1;
  uint32_t *puVar2;
  SPIRExpression *pSVar3;
  SPIRAccessChain *chain;
  ulong uVar4;
  string lhs;
  string rhs;
  undefined1 local_70 [24];
  char local_58 [32];
  string local_38;
  
  puVar2 = Compiler::stream((Compiler *)this,instruction);
  uVar4 = (ulong)*puVar2;
  if ((((this->super_CompilerGLSL).options.vertex.flip_vert_y == true) &&
      (uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size)) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar4].type == TypeExpression)) {
    pSVar3 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar4);
    uVar4 = (ulong)*puVar2;
    if (pSVar3->access_meshlet_position_y == true) {
      CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                ((string *)local_70,&this->super_CompilerGLSL,*puVar2,true);
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_38,&this->super_CompilerGLSL,puVar2[1],true);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[17],std::__cxx11::string&,char_const(&)[3]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (char (*) [17])" = spvFlipVertY(",&local_38,(char (*) [3])0x361553);
      Compiler::register_write((Compiler *)this,*puVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      if ((undefined1 *)local_70._0_8_ == local_70 + 0x10) {
        return;
      }
      operator_delete((void *)local_70._0_8_);
      return;
    }
  }
  if ((uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar4].type == TypeAccessChain)) {
    chain = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar4);
    local_70._8_8_ = 0;
    local_70._16_8_ = 8;
    local_70._0_8_ = local_58;
    write_access_chain(this,chain,puVar2[1],(SmallVector<unsigned_int,_8UL> *)local_70);
    local_70._8_8_ = 0;
    if ((char *)local_70._0_8_ != local_58) {
      free((void *)local_70._0_8_);
    }
    return;
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	if (options.vertex.flip_vert_y)
	{
		auto *expr = maybe_get<SPIRExpression>(ops[0]);
		if (expr != nullptr && expr->access_meshlet_position_y)
		{
			auto lhs = to_dereferenced_expression(ops[0]);
			auto rhs = to_unpacked_expression(ops[1]);
			statement(lhs, " = spvFlipVertY(", rhs, ");");
			register_write(ops[0]);
			return;
		}
	}

	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}